

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

void __thiscall mjs::array_object::put_length(array_object *this,value *v)

{
  uint uVar1;
  uint32_t uVar2;
  global_object *g;
  uint32_t extraout_EDX;
  uint32_t index;
  uint32_t extraout_EDX_00;
  double n;
  size_type local_58;
  pointer local_50;
  wstring local_48;
  
  uVar1 = this->length_;
  g = gc_heap_ptr_untracked<mjs::global_object,_true>::dereference
                ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
                 &(this->super_native_object).field_0x24,
                 (this->super_native_object).super_object.heap_);
  n = to_number(v);
  uVar2 = anon_unknown_110::check_array_length(g,n);
  this->length_ = uVar2;
  index = extraout_EDX;
  for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    index_string_abi_cxx11_(&local_48,(mjs *)(ulong)uVar2,index);
    local_58 = local_48._M_string_length;
    local_50 = local_48._M_dataplus._M_p;
    (*(this->super_native_object).super_object._vptr_object[2])(this,&local_58);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
    index = extraout_EDX_00;
  }
  return;
}

Assistant:

void put_length(const value& v) {
        // ES3, 15.4.5.1
        const auto old_length = length_;
        length_ = check_array_length(global_.dereference(heap()), to_number(v));
        for (auto l = length_; l < old_length; ++l) {
            delete_property(index_string(l));
        }
    }